

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O0

void LEARNER::generic_driver_onethread(vw *all)

{
  example *in_RDI;
  dispatch_fptr *in_stack_00000048;
  vw *in_stack_00000050;
  anon_class_8_1_898a702b multi_ex_fptr;
  multi_ex ctxt;
  multi_ex *in_stack_ffffffffffffff58;
  example *in_stack_ffffffffffffff60;
  anon_class_8_1_898a702b *in_stack_ffffffffffffff68;
  function<void_(vw_&,_v_array<example_*>_&)> *in_stack_ffffffffffffff70;
  function<void_(vw_&,_v_array<example_*>_&)> *this;
  undefined1 local_78 [80];
  function<void_(vw_&,_v_array<example_*>_&)> *local_28;
  function<void_(vw_&,_v_array<example_*>_&)> local_20;
  
  if (((uint)(in_RDI->super_example_predict).feature_space[0].values._end[0x3a] & 1) == 0) {
    std::function<void(vw&,v_array<example*>&)>::function<void(&)(vw&,v_array<example*>),void>
              (in_stack_ffffffffffffff70,(_func_void_vw_ptr_v_array<example_ptr> *)local_78);
    parse_dispatch(in_stack_00000050,in_stack_00000048);
    std::function<void_(vw_&,_v_array<example_*>_&)>::~function
              ((function<void_(vw_&,_v_array<example_*>_&)> *)0x252708);
  }
  else {
    this = &local_20;
    std::vector<example_*,_std::allocator<example_*>_>::vector
              ((vector<example_*,_std::allocator<example_*>_> *)0x25261a);
    local_28 = this;
    std::function<void(vw&,v_array<example*>&)>::
    function<LEARNER::generic_driver_onethread(vw&)::__0&,void>(this,in_stack_ffffffffffffff68);
    parse_dispatch(in_stack_00000050,in_stack_00000048);
    std::function<void_(vw_&,_v_array<example_*>_&)>::~function
              ((function<void_(vw_&,_v_array<example_*>_&)> *)0x252666);
    on_new_partial_ex<&LEARNER::process_multi_ex>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(vw *)0x25267f);
    std::vector<example_*,_std::allocator<example_*>_>::~vector
              ((vector<example_*,_std::allocator<example_*>_> *)this);
    in_RDI = in_stack_ffffffffffffff60;
  }
  learner<char,_char>::end_examples((learner<char,_char> *)in_RDI);
  return;
}

Assistant:

void generic_driver_onethread(vw& all)
{
  if (all.l->is_multiline)
  {
    multi_ex ctxt;
    auto multi_ex_fptr = [&ctxt](vw& all, v_array<example*> examples) {
      all.p->end_parsed_examples += examples.size();  // divergence: lock & signal
      for (size_t i = 0; i < examples.size(); ++i) on_new_partial_ex<process_multi_ex>(examples[i], ctxt, all);
    };

    parse_dispatch(all, multi_ex_fptr);

    // flush accumulated examples if there is no newline
    // at the end of the file
    on_new_partial_ex<process_multi_ex>(nullptr, ctxt, all);
  }
  else
    parse_dispatch(all, dispatch);

  all.l->end_examples();
}